

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorTypeWithDimValuesNV
          (ValidationState_t *_,Instruction *inst,ExpectedNumValues expected,bool is_view)

{
  char *pcVar1;
  ValidationState_t *this;
  bool bVar2;
  spv_result_t sVar3;
  uint uVar4;
  uint id;
  uint32_t uVar5;
  Instruction *pIVar6;
  DiagnosticStream *pDVar7;
  undefined7 in_register_00000009;
  long lVar8;
  int iVar9;
  size_t index;
  uint64_t dim_value;
  string type_str;
  char *local_260;
  ValidationState_t *local_258;
  char *local_250;
  char *local_248;
  char local_240;
  undefined7 uStack_23f;
  string local_230;
  char *local_210;
  DiagnosticStream local_208;
  
  local_250 = &local_240;
  local_248 = (char *)0x0;
  local_240 = '\0';
  if ((int)CONCAT71(in_register_00000009,is_view) == 0) {
    sVar3 = ValidateTensorLayoutResultTypeNV(_,inst);
    if (sVar3 != SPV_SUCCESS) goto LAB_0068e103;
    pcVar1 = "createTensorLayout";
  }
  else {
    sVar3 = ValidateTensorViewResultTypeNV(_,inst);
    if (sVar3 != SPV_SUCCESS) goto LAB_0068e103;
    pcVar1 = "createTensorView";
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,local_248,(ulong)(pcVar1 + 6));
  uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,0);
  id = Instruction::GetOperandAs<unsigned_int>(inst,2);
  pIVar6 = ValidationState_t::FindDef(_,id);
  if ((pIVar6 == (Instruction *)0x0) || (uVar4 != (pIVar6->inst_).type_id)) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    local_260 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar7 = DiagnosticStream::operator<<(&local_208,&local_260);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," Result Type <id> ",0x12);
    ValidationState_t::getIdName_abi_cxx11_(&local_230,_,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," does not match ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,local_250,(long)local_248);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," type.",6);
    sVar3 = pDVar7->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_0068e0ec:
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
LAB_0068e0f9:
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    lVar8 = (long)(inst->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(inst->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
    local_258 = _;
    bVar2 = ValidationState_t::EvalConstantValUint64(_,uVar4,(uint64_t *)&local_260);
    this = local_258;
    if (bVar2) {
      sVar3 = (*(code *)(&DAT_007b854c + *(int *)(&DAT_007b854c + (ulong)expected * 4)))();
      return sVar3;
    }
    sVar3 = SPV_SUCCESS;
    if (lVar8 != 3) {
      index = 3;
      do {
        iVar9 = (int)index;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        pIVar6 = ValidationState_t::FindDef(this,uVar4);
        if (((pIVar6 == (Instruction *)0x0) ||
            (bVar2 = ValidationState_t::IsIntScalarType(this,(pIVar6->inst_).type_id), !bVar2)) ||
           (uVar5 = ValidationState_t::GetBitWidth(this,(pIVar6->inst_).type_id), uVar5 != 0x20)) {
          ValidationState_t::diag(&local_208,this,SPV_ERROR_INVALID_ID,inst);
          local_210 = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar7 = DiagnosticStream::operator<<(&local_208,&local_210);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," operand <id> ",0xe)
          ;
          ValidationState_t::getIdName_abi_cxx11_(&local_230,this,uVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar7," is not a 32-bit integer.",0x19);
          sVar3 = pDVar7->error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p == &local_230.field_2) goto LAB_0068e0f9;
          goto LAB_0068e0ec;
        }
        index = (size_t)(iVar9 + 1);
        sVar3 = SPV_SUCCESS;
      } while ((ulong)(iVar9 - 2) < lVar8 - 3U);
    }
  }
LAB_0068e103:
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  return sVar3;
}

Assistant:

spv_result_t ValidateTensorTypeWithDimValuesNV(ValidationState_t& _,
                                               const Instruction* inst,
                                               ExpectedNumValues expected,
                                               bool is_view) {
  std::string type_str;
  if (is_view) {
    if (auto error = ValidateTensorViewResultTypeNV(_, inst)) return error;
    type_str = "TensorView";
  } else {
    if (auto error = ValidateTensorLayoutResultTypeNV(_, inst)) return error;
    type_str = "TensorLayout";
  }

  const auto result_type_id = inst->GetOperandAs<uint32_t>(0);
  const auto tensor_id = inst->GetOperandAs<uint32_t>(2);
  const auto tensor = _.FindDef(tensor_id);
  if (!tensor || result_type_id != tensor->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " does not match " << type_str
           << " type.";
  }

  const auto num_values = inst->operands().size() - 3;

  const auto result_type = _.FindDef(result_type_id);
  const auto dim_index = 1;
  const auto dim_id = result_type->GetOperandAs<uint32_t>(dim_index);
  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    uint64_t expected_num_values = 0;
    switch (expected) {
      case DIM:
        expected_num_values = dim_value;
        break;
      case DIMx2:
        expected_num_values = dim_value * 2;
        break;
      case ONE:
        expected_num_values = 1;
        break;
      case FOUR:
        expected_num_values = 4;
        break;
    }

    if (num_values != expected_num_values) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode())
             << " unexpected number of operands.";
    }
  }

  for (uint32_t i = 0; i < num_values; ++i) {
    const auto val_id = inst->GetOperandAs<uint32_t>(i + 3);
    const auto val = _.FindDef(val_id);
    if (!val || !_.IsIntScalarType(val->type_id()) ||
        _.GetBitWidth(val->type_id()) != 32) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " operand <id> "
             << _.getIdName(val_id) << " is not a 32-bit integer.";
    }
  }

  return SPV_SUCCESS;
}